

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

Insertion_return * __thiscall
Gudhi::persistence_matrix::
Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>
::
insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Insertion_return *__return_storage_ptr__,void *this,ID_index cellIndex,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *boundary,Dimension dim)

{
  logic_error *this_00;
  uint dimension;
  ulong uVar1;
  value_type_conflict local_2c;
  
  if (**this != -1) {
    if ((ulong)(*(long *)((long)this + 0xa8) - *(long *)((long)this + 0xa0) >> 2) <=
        (ulong)cellIndex) {
      local_2c = 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)this + 0xa0),
                 (ulong)(cellIndex * 2 + 1),&local_2c);
    }
    dimension = dim;
    if (dim == -1) {
      uVar1 = (long)(boundary->
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(boundary->
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      if (uVar1 == 0) {
        dimension = 0;
      }
      else {
        dimension = (int)(uVar1 >> 3) - 1;
      }
    }
    Matrix_all_dimension_holder<int>::update_up
              ((Matrix_all_dimension_holder<int> *)((long)this + 8),dimension);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
    ::
    _reduce_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
              (__return_storage_ptr__,
               (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
                *)((long)this + 8),cellIndex,boundary,dim);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,
             "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
            );
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline typename Matrix<PersistenceMatrixOptions>::Insertion_return
Matrix<PersistenceMatrixOptions>::insert_boundary(ID_index cellIndex,
                                                  const Boundary_range& boundary,
                                                  Dimension dim)
{
  if constexpr (!PersistenceMatrixOptions::is_z2){
    GUDHI_CHECK(colSettings_->operators.get_characteristic() != get_null_value<Characteristic>(),
                std::logic_error("Matrix::insert_boundary - Columns cannot be initialized if the coefficient field "
                                 "characteristic is not specified."));
  }

  static_assert(isNonBasic, "Only enabled for non-basic matrices.");
  if constexpr (!PersistenceMatrixOptions::is_of_boundary_type &&
                PersistenceMatrixOptions::column_indexation_type == Column_indexation_types::CONTAINER)
    return matrix_.insert_boundary(cellIndex, boundary, dim);
  else
    matrix_.insert_boundary(cellIndex, boundary, dim);
}